

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

CutoffGroup * __thiscall
OpenMD::MoleculeCreator::createCutoffGroup
          (MoleculeCreator *this,Molecule *mol,CutoffGroupStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  int iVar1;
  CutoffGroup *this_00;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  this_00 = (CutoffGroup *)operator_new(0x40);
  (this_00->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00->globalIndex = -1;
  this_00->localIndex_ = -1;
  this_00->snapshotMan_ = (SnapshotManager *)0x0;
  this_00->storage_ = 0x380;
  this_00->haveTotalMass = false;
  this_00->totalMass = 0.0;
  lVar3 = (long)(stamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(stamp->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  lVar2 = 0;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    CutoffGroup::addAtom
              (this_00,(mol->atoms_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [*(uint *)((long)(stamp->members_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + (lVar2 >> 0x1e))]);
    lVar2 = lVar2 + 0x100000000;
  }
  iVar1 = IndexListContainer::pop(&localIndexMan->cutoffGroupIndexContainer_);
  this_00->localIndex_ = iVar1;
  return this_00;
}

Assistant:

CutoffGroup* MoleculeCreator::createCutoffGroup(
      Molecule* mol, CutoffGroupStamp* stamp,
      LocalIndexManager* localIndexMan) {
    size_t nAtoms;
    CutoffGroup* cg;
    Atom* atom;
    cg = new CutoffGroup();

    nAtoms = stamp->getNMembers();
    for (size_t i = 0; i < nAtoms; ++i) {
      atom = mol->getAtomAt(stamp->getMemberAt(i));
      assert(atom);
      cg->addAtom(atom);
    }

    // set the local index of this cutoffGroup, global index will be set later
    cg->setLocalIndex(localIndexMan->getNextCutoffGroupIndex());

    return cg;
  }